

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32_c_api_tests.c
# Opt level: O2

void encode_whenCppMethodThrowsException_isUnsuccessful(void)

{
  bech32_error bVar1;
  size_t hrplen;
  bech32_bstring *bstring;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  uchar dp [3];
  char hrp [85];
  
  pcVar3 = "aaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaa";
  pcVar4 = hrp;
  for (lVar2 = 0x55; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pcVar4 = *pcVar3;
    pcVar3 = pcVar3 + 1;
    pcVar4 = pcVar4 + 1;
  }
  dp[2] = '\x03';
  dp[0] = '\x01';
  dp[1] = '\x02';
  hrplen = strlen(hrp);
  bstring = bech32_create_bstring(hrplen,3);
  bVar1 = bech32_encode(bstring,hrp,dp,3);
  if (bVar1 == E_BECH32_UNKNOWN_ERROR) {
    bech32_free_bstring(bstring);
    return;
  }
  __assert_fail("bech32_encode(bstring, hrp, dp, sizeof(dp)) == E_BECH32_UNKNOWN_ERROR",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                ,0x129,"void encode_whenCppMethodThrowsException_isUnsuccessful(void)");
}

Assistant:

void encode_whenCppMethodThrowsException_isUnsuccessful(void) {
    // bech32 string can only have HRPs that are 83 chars or less. Attempt to encode an HRP string
    // with more than 83 chars and make sure that the exception thrown in the C++ code is caught
    // and returns an error code
    char hrp[] = "aaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaa";
    unsigned char dp[] = {1,2,3};
    bech32_bstring *bstring = bech32_create_bstring(strlen(hrp), sizeof(dp));

    assert(bech32_encode(bstring, hrp, dp, sizeof(dp)) == E_BECH32_UNKNOWN_ERROR);

    bech32_free_bstring(bstring);
}